

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ColorEditRestoreHS(float *col,float *H,float *S,float *V)

{
  ImU32 IVar1;
  float *in_RCX;
  float *in_RDX;
  float *in_RSI;
  float *in_RDI;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffffc0;
  ImU32 IVar2;
  ImVec4 local_38;
  ImGuiContext *local_28;
  float *local_20;
  float *local_18;
  float *local_10;
  
  local_28 = GImGui;
  IVar2 = GImGui->ColorEditLastColor;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  ImVec4::ImVec4(&local_38,*in_RDI,in_RDI[1],in_RDI[2],0.0);
  IVar1 = ImGui::ColorConvertFloat4ToU32((ImVec4 *)CONCAT44(IVar2,in_stack_ffffffffffffffc0));
  if (IVar2 == IVar1) {
    if (((*local_18 == 0.0) && (!NAN(*local_18))) ||
       ((*local_10 == 0.0 &&
        (((!NAN(*local_10) && (local_28->ColorEditLastHue == 1.0)) &&
         (!NAN(local_28->ColorEditLastHue))))))) {
      *local_10 = local_28->ColorEditLastHue;
    }
    if ((*local_20 == 0.0) && (!NAN(*local_20))) {
      *local_18 = local_28->ColorEditLastSat;
    }
  }
  return;
}

Assistant:

static void ColorEditRestoreHS(const float* col, float* H, float* S, float* V)
{
    // This check is optional. Suppose we have two color widgets side by side, both widgets display different colors, but both colors have hue and/or saturation undefined.
    // With color check: hue/saturation is preserved in one widget. Editing color in one widget would reset hue/saturation in another one.
    // Without color check: common hue/saturation would be displayed in all widgets that have hue/saturation undefined.
    // g.ColorEditLastColor is stored as ImU32 RGB value: this essentially gives us color equality check with reduced precision.
    // Tiny external color changes would not be detected and this check would still pass. This is OK, since we only restore hue/saturation _only_ if they are undefined,
    // therefore this change flipping hue/saturation from undefined to a very tiny value would still be represented in color picker.
    ImGuiContext& g = *GImGui;
    if (g.ColorEditLastColor != ImGui::ColorConvertFloat4ToU32(ImVec4(col[0], col[1], col[2], 0)))
        return;

    // When S == 0, H is undefined.
    // When H == 1 it wraps around to 0.
    if (*S == 0.0f || (*H == 0.0f && g.ColorEditLastHue == 1))
        *H = g.ColorEditLastHue;

    // When V == 0, S is undefined.
    if (*V == 0.0f)
        *S = g.ColorEditLastSat;
}